

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O3

int nn_sock_init(nn_sock *self,nn_socktype *socktype,int fd)

{
  nn_ctx *self_00;
  nn_efd *self_01;
  int iVar1;
  nn_pool *pool;
  
  if ((~socktype->flags & 3U) == 0) {
    nn_sock_init_cold_2();
  }
  else {
    self_00 = &self->ctx;
    pool = nn_global_getpool();
    nn_ctx_init(self_00,pool,nn_sock_onleave);
    nn_fsm_init_root(&self->fsm,nn_sock_handler,nn_sock_shutdown,self_00);
    self->state = 1;
    self_01 = &self->sndfd;
    if ((socktype->flags & 2) == 0) {
      iVar1 = nn_efd_init(self_01);
      if (iVar1 < 0) {
        return iVar1;
      }
    }
    else {
      self_01->efd = -0x32323233;
    }
    if ((socktype->flags & 1) == 0) {
      iVar1 = nn_efd_init(&self->rcvfd);
      if (iVar1 < 0) {
        if ((socktype->flags & 2) != 0) {
          return iVar1;
        }
        nn_efd_term(self_01);
        return iVar1;
      }
    }
    else {
      (self->rcvfd).efd = -0x32323233;
    }
    nn_sem_init(&self->termsem);
    nn_sem_init(&self->relesem);
    self->holds = 1;
    self->flags = 0;
    nn_list_init(&self->eps);
    nn_list_init(&self->sdeps);
    self->eid = 1;
    self->sndbuf = 0x20000;
    self->rcvbuf = 0x20000;
    self->rcvmaxsize = 0x100000;
    self->sndtimeo = -1;
    self->rcvtimeo = -1;
    self->reconnect_ivl = 100;
    self->reconnect_ivl_max = 0;
    self->maxttl = 8;
    (self->ep_template).sndprio = 8;
    (self->ep_template).rcvprio = 8;
    (self->ep_template).ipv4only = 1;
    (self->statistics).established_connections = 0;
    (self->statistics).accepted_connections = 0;
    (self->statistics).dropped_connections = 0;
    (self->statistics).broken_connections = 0;
    (self->statistics).connect_errors = 0;
    (self->statistics).bind_errors = 0;
    (self->statistics).accept_errors = 0;
    (self->statistics).messages_sent = 0;
    (self->statistics).messages_received = 0;
    (self->statistics).bytes_sent = 0;
    (self->statistics).bytes_received = 0;
    (self->statistics).current_connections = 0;
    (self->statistics).inprogress_connections = 0;
    (self->statistics).current_snd_priority = 0;
    (self->statistics).current_ep_errors = 0;
    sprintf(self->socket_name,"%d",(ulong)(uint)fd);
    self->sec_attr = (void *)0x0;
    self->sec_attr_size = 0;
    self->outbuffersz = 0x1000;
    self->inbuffersz = 0x1000;
    self->optsets[0] = (nn_optset *)0x0;
    self->optsets[1] = (nn_optset *)0x0;
    self->optsets[2] = (nn_optset *)0x0;
    self->optsets[3] = (nn_optset *)0x0;
    iVar1 = (*socktype->create)(self,&self->sockbase);
    if (iVar1 == 0) {
      self->socktype = socktype;
      nn_ctx_enter(self_00);
      nn_fsm_start(&self->fsm);
      nn_ctx_leave(self_00);
      return 0;
    }
  }
  nn_sock_init_cold_1();
}

Assistant:

int nn_sock_init (struct nn_sock *self, const struct nn_socktype *socktype,
    int fd)
{
    int rc;
    int i;

    /* Make sure that at least one message direction is supported. */
    nn_assert (!(socktype->flags & NN_SOCKTYPE_FLAG_NOSEND) ||
        !(socktype->flags & NN_SOCKTYPE_FLAG_NORECV));

    /*  Create the AIO context for the SP socket. */
    nn_ctx_init (&self->ctx, nn_global_getpool (), nn_sock_onleave);

    /*  Initialise the state machine. */
    nn_fsm_init_root (&self->fsm, nn_sock_handler,
        nn_sock_shutdown, &self->ctx);
    self->state = NN_SOCK_STATE_INIT;

    /*  Open the NN_SNDFD and NN_RCVFD efds. Do so, only if the socket type
        supports send/recv, as appropriate. */
    if (socktype->flags & NN_SOCKTYPE_FLAG_NOSEND)
        memset (&self->sndfd, 0xcd, sizeof (self->sndfd));
    else {
        rc = nn_efd_init (&self->sndfd);
        if (nn_slow (rc < 0))
            return rc;
    }
    if (socktype->flags & NN_SOCKTYPE_FLAG_NORECV)
        memset (&self->rcvfd, 0xcd, sizeof (self->rcvfd));
    else {
        rc = nn_efd_init (&self->rcvfd);
        if (nn_slow (rc < 0)) {
            if (!(socktype->flags & NN_SOCKTYPE_FLAG_NOSEND))
                nn_efd_term (&self->sndfd);
            return rc;
        }
    }
    nn_sem_init (&self->termsem);
    nn_sem_init (&self->relesem);
    if (nn_slow (rc < 0)) {
        if (!(socktype->flags & NN_SOCKTYPE_FLAG_NORECV))
            nn_efd_term (&self->rcvfd);
        if (!(socktype->flags & NN_SOCKTYPE_FLAG_NOSEND))
            nn_efd_term (&self->sndfd);
        return rc;
    }

    self->holds = 1;   /*  Callers hold. */
    self->flags = 0;
    nn_list_init (&self->eps);
    nn_list_init (&self->sdeps);
    self->eid = 1;

    /*  Default values for NN_SOL_SOCKET options. */
    self->sndbuf = 128 * 1024;
    self->rcvbuf = 128 * 1024;
    self->rcvmaxsize = 1024 * 1024;
    self->sndtimeo = -1;
    self->rcvtimeo = -1;
    self->reconnect_ivl = 100;
    self->reconnect_ivl_max = 0;
    self->maxttl = 8;
    self->ep_template.sndprio = 8;
    self->ep_template.rcvprio = 8;
    self->ep_template.ipv4only = 1;

    /* Clear statistic entries */
    memset(&self->statistics, 0, sizeof (self->statistics));

    /*  Should be pretty much enough space for just the number  */
    sprintf(self->socket_name, "%d", fd);

    /* Security attribute */
    self->sec_attr = NULL;
    self->sec_attr_size = 0;
    self->inbuffersz = 4096;
    self->outbuffersz = 4096;

    /*  The transport-specific options are not initialised immediately,
        rather, they are allocated later on when needed. */
    for (i = 0; i != NN_MAX_TRANSPORT; ++i)
        self->optsets [i] = NULL;

    /*  Create the specific socket type itself. */
    rc = socktype->create ((void*) self, &self->sockbase);
    errnum_assert (rc == 0, -rc);
    self->socktype = socktype;

    /*  Launch the state machine. */
    nn_ctx_enter (&self->ctx);
    nn_fsm_start (&self->fsm);
    nn_ctx_leave (&self->ctx);

    return 0;
}